

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

BlockStatement * slang::ast::BlockStatement::makeEmpty(Compilation *compilation)

{
  Statement *args_2;
  BlockStatement *pBVar1;
  StatementBlockKind *args_1;
  Statement *args;
  SourceLocation in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  args_2 = StatementList::makeEmpty
                     ((Compilation *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  args = (Statement *)0xffffffffffffffff;
  args_1 = (StatementBlockKind *)0xffffffffffffffff;
  SourceRange::SourceRange
            ((SourceRange *)&stack0xffffffffffffffe0,(SourceLocation)0xffffffffffffffff,
             (SourceLocation)0xffffffffffffffff);
  pBVar1 = BumpAllocator::
           emplace<slang::ast::BlockStatement,slang::ast::Statement&,slang::ast::StatementBlockKind,slang::SourceRange>
                     ((BumpAllocator *)in_stack_ffffffffffffffe0,args,args_1,(SourceRange *)args_2);
  return pBVar1;
}

Assistant:

BlockStatement& BlockStatement::makeEmpty(Compilation& compilation) {
    return *compilation.emplace<BlockStatement>(
        StatementList::makeEmpty(compilation), StatementBlockKind::Sequential,
        SourceRange(SourceLocation::NoLocation, SourceLocation::NoLocation));
}